

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QRect __thiscall
QItemDelegate::textRectangle
          (QItemDelegate *this,QPainter *param_1,QRect *rect,QFont *font,QString *text)

{
  QTextLayout *pQVar1;
  QItemDelegatePrivate *this_00;
  undefined1 auVar2 [16];
  QString text_00;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  qreal __x;
  QSizeF QVar7;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  *(uint *)&this_00->textOption = *(uint *)&this_00->textOption & 0xffffe1ff | 0x200;
  pQVar1 = &this_00->textLayout;
  QTextLayout::setTextOption((QTextOption *)pQVar1);
  QTextLayout::setFont((QFont *)pQVar1);
  local_60.d = (text->d).d;
  local_60.ptr = (text->d).ptr;
  local_60.size = (text->d).size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  text_00.d.ptr = (char16_t *)in_stack_ffffffffffffff90;
  text_00.d.d = (Data *)in_stack_ffffffffffffff88;
  text_00.d.size = in_stack_ffffffffffffff98;
  QItemDelegatePrivate::replaceNewLine((QString *)&local_48,text_00);
  QTextLayout::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QVar7 = QItemDelegatePrivate::doTextLayout(this_00,((rect->x2).m_i - (rect->x1).m_i) + 1);
  __x = QVar7.ht;
  dVar5 = ceil(QVar7.wd);
  dVar6 = ceil(__x);
  pQVar4 = QApplication::style();
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x41,0,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    auVar2._4_4_ = (int)dVar6 + -1;
    auVar2._0_4_ = (int)dVar5 + iVar3 * 2 + 1;
    auVar2._8_8_ = 0;
    return (QRect)(auVar2 << 0x40);
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::textRectangle(QPainter * /*painter*/, const QRect &rect,
                                   const QFont &font, const QString &text) const
{
    Q_D(const QItemDelegate);
    d->textOption.setWrapMode(QTextOption::WordWrap);
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));
    QSizeF fpSize = d->doTextLayout(rect.width());
    const QSize size = QSize(qCeil(fpSize.width()), qCeil(fpSize.height()));
    // ###: textRectangle should take style option as argument
    const int textMargin = QApplication::style()->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr) + 1;
    return QRect(0, 0, size.width() + 2 * textMargin, size.height());
}